

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample02.cpp
# Opt level: O0

long __thiscall PyAnimal::go_abi_cxx11_(PyAnimal *this)

{
  bool bVar1;
  Animal *in_RSI;
  object local_50;
  object o;
  handle local_38;
  function overload;
  gil_scoped_acquire gil;
  int n_times_local;
  PyAnimal *this_local;
  
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&overload);
  pybind11::get_overload<Animal>((pybind11 *)&local_38,in_RSI,"go");
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_38);
  if (bVar1) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_50,(int *)&local_38);
    pybind11::detail::cast_safe<std::__cxx11::string>((detail *)this,&local_50);
    pybind11::object::~object(&local_50);
  }
  pybind11::function::~function((function *)&local_38);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&overload);
  if (!bVar1) {
    pybind11::pybind11_fail("Tried to call pure virtual function \"Animal::go\"");
  }
  return (long)this;
}

Assistant:

std::string go(int n_times) override {
		PYBIND11_OVERLOAD_PURE(std::string, Animal, go, n_times);
	}